

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestOneofParsingLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t uVar1;
  uint32_t uVar2;
  TestOneofParsingLite **v1;
  TestOneofParsingLite **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  TestAllTypesLite *pTVar4;
  anon_union_16_1_493b367e_for_TestOneofParsingLite_3 *paVar5;
  Cord *pCVar6;
  string *psVar7;
  bool bVar8;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  TestOneofParsingLite *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestOneofParsingLite *from;
  TestOneofParsingLite *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestOneofParsingLite *)to_msg;
  _this = (TestOneofParsingLite *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_50 = (TestOneofParsingLite *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestOneofParsingLite_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestOneofParsingLite*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestOneofParsingLite_const*,proto2_unittest::TestOneofParsingLite*>
                       (v1,v2,"&from != _this");
  if (local_48 == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint32_t *)((long)&(arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i + 4);
    if (uVar1 != 0) {
      uVar2 = (from->field_0)._impl_._oneof_case_[0];
      bVar8 = uVar2 != uVar1;
      if (bVar8) {
        if (uVar2 != 0) {
          clear_oneof_field(from);
        }
        (from->field_0)._impl_._oneof_case_[0] = uVar1;
      }
      switch(uVar1) {
      case 0:
        break;
      case 1:
        *(undefined4 *)&from->field_0 = *(undefined4 *)&(arena->impl_).field_0x10;
        break;
      case 2:
        if (bVar8) {
          to_msg_local = *(MessageLite **)&(arena->impl_).field_0x10;
          local_10 = absl_log_internal_check_op_result;
          pTVar4 = (TestAllTypesLite *)
                   google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                             ((Arena *)absl_log_internal_check_op_result,to_msg_local);
          (from->field_0)._impl_.oneof_field_.oneof_submessage_ = pTVar4;
        }
        else {
          TestAllTypesLite::MergeFrom
                    ((from->field_0)._impl_.oneof_field_.oneof_submessage_,
                     *(TestAllTypesLite **)&(arena->impl_).field_0x10);
        }
        break;
      case 3:
        if (bVar8) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    ((ArenaStringPtr *)&(from->field_0)._impl_);
        }
        paVar5 = &from->field_0;
        psVar7 = _internal_oneof_string_abi_cxx11_((TestOneofParsingLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&paVar5->_impl_,psVar7,
                   (Arena *)absl_log_internal_check_op_result);
        break;
      case 4:
        if (bVar8) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    ((ArenaStringPtr *)&(from->field_0)._impl_);
        }
        paVar5 = &from->field_0;
        psVar7 = _internal_oneof_bytes_abi_cxx11_((TestOneofParsingLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&paVar5->_impl_,psVar7,
                   (Arena *)absl_log_internal_check_op_result);
        break;
      case 5:
        if (bVar8) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    ((ArenaStringPtr *)&(from->field_0)._impl_);
        }
        paVar5 = &from->field_0;
        psVar7 = _internal_oneof_string_cord_abi_cxx11_((TestOneofParsingLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&paVar5->_impl_,psVar7,
                   (Arena *)absl_log_internal_check_op_result);
        break;
      case 6:
        if (bVar8) {
          pCVar6 = google::protobuf::Arena::Create<absl::lts_20250127::Cord>
                             ((Arena *)absl_log_internal_check_op_result);
          (from->field_0)._impl_.oneof_field_.oneof_bytes_cord_ = pCVar6;
        }
        absl::lts_20250127::Cord::operator=
                  ((from->field_0)._impl_.oneof_field_.oneof_bytes_cord_,
                   *(Cord **)&(arena->impl_).field_0x10);
        break;
      case 7:
        if (bVar8) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    ((ArenaStringPtr *)&(from->field_0)._impl_);
        }
        paVar5 = &from->field_0;
        psVar7 = _internal_oneof_string_string_piece_abi_cxx11_((TestOneofParsingLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&paVar5->_impl_,psVar7,
                   (Arena *)absl_log_internal_check_op_result);
        break;
      case 8:
        if (bVar8) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    ((ArenaStringPtr *)&(from->field_0)._impl_);
        }
        paVar5 = &from->field_0;
        psVar7 = _internal_oneof_bytes_string_piece_abi_cxx11_((TestOneofParsingLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&paVar5->_impl_,psVar7,
                   (Arena *)absl_log_internal_check_op_result);
        break;
      case 9:
        *(undefined4 *)&from->field_0 = *(undefined4 *)&(arena->impl_).field_0x10;
      }
    }
    google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
              (&(from->super_MessageLite)._internal_metadata_,
               (InternalMetadata *)&(arena->impl_).alloc_policy_);
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
             ,0x2d3a,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

void TestOneofParsingLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestOneofParsingLite*>(&to_msg);
  auto& from = static_cast<const TestOneofParsingLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestOneofParsingLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofInt32: {
        _this->_impl_.oneof_field_.oneof_int32_ = from._impl_.oneof_field_.oneof_int32_;
        break;
      }
      case kOneofSubmessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_submessage_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_submessage_);
        } else {
          _this->_impl_.oneof_field_.oneof_submessage_->MergeFrom(*from._impl_.oneof_field_.oneof_submessage_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case kOneofStringCord: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_cord_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_cord_.Set(from._internal_oneof_string_cord(), arena);
        break;
      }
      case kOneofBytesCord: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_cord_ = ::google::protobuf::Arena::Create<absl::Cord>(arena);
        }
        *_this->_impl_.oneof_field_.oneof_bytes_cord_ = *from._impl_.oneof_field_.oneof_bytes_cord_;
        break;
      }
      case kOneofStringStringPiece: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_string_piece_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_string_piece_.Set(from._internal_oneof_string_string_piece(), arena);
        break;
      }
      case kOneofBytesStringPiece: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_string_piece_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_string_piece_.Set(from._internal_oneof_bytes_string_piece(), arena);
        break;
      }
      case kOneofEnum: {
        _this->_impl_.oneof_field_.oneof_enum_ = from._impl_.oneof_field_.oneof_enum_;
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}